

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_suite.cpp
# Opt level: O3

void number_suite::run(void)

{
  test_zero();
  test_int8();
  test_uint8();
  test_int16();
  test_uint16();
  test_int32();
  test_uint32();
  test_int64();
  test_uint64();
  test_float();
  test_double();
  return;
}

Assistant:

void run()
{
    test_zero();
    test_int8();
    test_uint8();
    test_int16();
    test_uint16();
    test_int32();
    test_uint32();
    test_int64();
    test_uint64();
    test_float();
    test_double();
}